

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::CheckElementShapeDimension(TPZCheckMesh *this)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  int64_t iVar7;
  TPZCompEl **ppTVar8;
  long *plVar9;
  TPZConnect *pTVar10;
  ostream *poVar11;
  void *pvVar12;
  undefined8 *in_RDI;
  int blsize;
  int seqnum;
  int nshape;
  TPZConnect *c;
  int cind;
  int ic;
  int nc;
  TPZInterpolatedElement *cint;
  TPZCompEl *cel;
  int el;
  int nelem;
  int check;
  int in_stack_ffffffffffffff7c;
  TPZBlock *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff98;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffffa0;
  TPZChunkVector<TPZCompEl_*,_10> *pTVar13;
  int local_30;
  int local_14;
  int local_c;
  
  local_c = 0;
  this_00 = TPZCompMesh::ElementVec((TPZCompMesh *)*in_RDI);
  iVar7 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>);
  for (local_14 = 0; local_14 < (int)iVar7; local_14 = local_14 + 1) {
    TPZCompMesh::ElementVec((TPZCompMesh *)*in_RDI);
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
    pTVar13 = (TPZChunkVector<TPZCompEl_*,_10> *)*ppTVar8;
    if (pTVar13 != (TPZChunkVector<TPZCompEl_*,_10> *)0x0) {
      if (pTVar13 == (TPZChunkVector<TPZCompEl_*,_10> *)0x0) {
        plVar9 = (long *)0x0;
        in_stack_ffffffffffffffa0 = pTVar13;
      }
      else {
        plVar9 = (long *)__dynamic_cast(pTVar13,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0);
        in_stack_ffffffffffffffa0 = pTVar13;
      }
      in_stack_ffffffffffffff98 = plVar9;
      if (plVar9 != (long *)0x0) {
        iVar2 = (**(code **)(*plVar9 + 0x90))();
        for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
          iVar3 = (**(code **)(*plVar9 + 0xa0))(plVar9,local_30);
          pTVar10 = (TPZConnect *)(**(code **)(*plVar9 + 0xa8))(plVar9,local_30);
          uVar1 = TPZConnect::Order(pTVar10);
          uVar4 = (**(code **)(*plVar9 + 0x260))(plVar9,local_30,uVar1);
          uVar5 = TPZConnect::NShape(pTVar10);
          if (uVar5 != uVar4) {
            poVar11 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_14);
            poVar11 = std::operator<<(poVar11," connect = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar3);
            poVar11 = std::operator<<(poVar11," nshape = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
            in_stack_ffffffffffffff80 = (TPZBlock *)std::operator<<(poVar11," c.NShape ");
            uVar5 = TPZConnect::NShape(pTVar10);
            pvVar12 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff80,uVar5);
            std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
            local_c = 1;
          }
          *(undefined4 *)(in_RDI + 2) = 1;
          TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
          pTVar10 = TPZChunkVector<TPZConnect,_10>::operator[]
                              ((TPZChunkVector<TPZConnect,_10> *)in_stack_ffffffffffffffa0,
                               (int64_t)in_stack_ffffffffffffff98);
          TPZConnect::SequenceNumber(pTVar10);
          TPZCompMesh::Block((TPZCompMesh *)*in_RDI);
          iVar6 = TPZBlock::Size(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (uVar4 * *(int *)(in_RDI + 2) != iVar6) {
            poVar11 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckElement.. el = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_14);
            poVar11 = std::operator<<(poVar11," connect = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar3);
            poVar11 = std::operator<<(poVar11," nshape = ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar4);
            poVar11 = std::operator<<(poVar11," blsize ");
            pvVar12 = (void *)std::ostream::operator<<(poVar11,iVar6);
            std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
            (**(code **)(*plVar9 + 200))(plVar9,&std::cout);
            local_c = 1;
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

int TPZCheckMesh::CheckElementShapeDimension() {
	int check = 0;
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
		TPZInterpolatedElement *cint = dynamic_cast<TPZInterpolatedElement *> (cel);
		if(!cint) continue;
		int nc = cint->NConnects();
		int ic;
		for(ic=0; ic<nc; ic++) {
			int cind = cint->ConnectIndex(ic);
            TPZConnect &c = cint->Connect(ic);
			int nshape = cint->NConnectShapeF(ic,c.Order());
            if (c.NShape() != nshape) {
                cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
                << cind << " nshape = " << nshape << " c.NShape " << c.NShape() << endl;
                check =1 ;
            }
			fNState = 1;                                                      /// WARNING
			int seqnum = fMesh->ConnectVec()[cind].SequenceNumber();
			int blsize = fMesh->Block().Size(seqnum);
			if(nshape*fNState != blsize) {
				cout << "TPZCheckMesh::CheckElement.. el = " << el << " connect = "
				<< cind << " nshape = " << nshape << " blsize " << blsize << endl;
				cint->Print(cout);
				check = 1;
			}
		}
	}
	return check;
}